

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s - manage PF_CAN netlink gateway.\n",in_RDI);
  fprintf(_stderr,"\nUsage: %s [options]\n\n",in_RDI);
  fprintf(_stderr,"Commands:\n");
  fprintf(_stderr,"          -A  (add a new rule)\n");
  fprintf(_stderr,"          -D  (delete a rule)\n");
  fprintf(_stderr,"          -F  (flush / delete all rules)\n");
  fprintf(_stderr,"          -L  (list all rules)\n");
  fprintf(_stderr,"Mandatory:\n");
  fprintf(_stderr,"          -s <src_dev>  (source netdevice)\n");
  fprintf(_stderr,"          -d <dst_dev>  (destination netdevice)\n");
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"          -X  (this is a CAN FD rule)\n");
  fprintf(_stderr,"          -t  (preserve src_dev rx timestamp)\n");
  fprintf(_stderr,"          -e  (echo sent frames - recommended on vcanx)\n");
  fprintf(_stderr,"          -i  (allow to route to incoming interface)\n");
  fprintf(_stderr,"          -u <uid>  (user defined modification identifier)\n");
  fprintf(_stderr,"          -l <hops>  (limit the number of frame hops / routings)\n");
  fprintf(_stderr,"          -f <filter>  (set CAN filter)\n");
  fprintf(_stderr,"          -m <mod>  (set Classical CAN frame modifications)\n");
  fprintf(_stderr,"          -M <MOD>  (set CAN FD frame modifications)\n");
  fprintf(_stderr,"          -x <from_idx>:<to_idx>:<result_idx>:<init_xor_val>  (XOR checksum)\n");
  fprintf(_stderr,
          "          -c <from>:<to>:<result>:<init_val>:<xor_val>:<crctab[256]>  (CRC8 cs)\n");
  fprintf(_stderr,"          -p <profile>:[<profile_data>]  (CRC8 checksum profile & parameters)\n")
  ;
  fprintf(_stderr,
          "\nValues are given and expected in hexadecimal values. Leading 0s can be omitted.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"<filter> is a <value><mask> CAN identifier filter:\n");
  fprintf(_stderr,
          "  <can_id>:<can_mask>  (matches when <received_can_id> & mask == can_id & mask)\n");
  fprintf(_stderr,
          "  <can_id>~<can_mask>  (matches when <received_can_id> & mask != can_id & mask)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"<mod> is a Classical CAN frame modification instruction consisting of\n");
  fprintf(_stderr,"<instruction>:<can_frame-elements>:<can_id>.<can_dlc>.<can_data>\n");
  fprintf(_stderr,"  <instruction>  is one of \'AND\' \'OR\' \'XOR\' \'SET\'\n");
  fprintf(_stderr,
          "  <can_frame-elements>  is _one_ or _more_ of \'I\'dentifier \'L\'ength \'D\'ata\n");
  fprintf(_stderr,"  <can_id>  is an u32 value containing the CAN Identifier\n");
  fprintf(_stderr,"  <can_dlc>  is an u8 value containing the data length code in hex (0 .. F)\n");
  fprintf(_stderr,"  <can_data>  is always eight(!) u8 values containing the CAN frames data\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"<MOD> is a CAN FD frame modification instruction consisting of\n");
  fprintf(_stderr,"<instruction>:<canfd_frame-elements>:<can_id>.<flags>.<len>.<can_data>\n");
  fprintf(_stderr,"  <instruction>  is one of \'AND\' \'OR\' \'XOR\' \'SET\'\n");
  fprintf(_stderr,
          "  <canfd_frame-elements>  is _one_ or _more_ of \'I\'d \'F\'lags \'L\'ength \'D\'ata\n");
  fprintf(_stderr,"  <can_id>  is an u32 value containing the CAN FD Identifier\n");
  fprintf(_stderr,"  <flags>  is an u8 value containing CAN FD flags (CANFD_BRS, CANFD_ESI)\n");
  fprintf(_stderr,"  <len>  is an u8 value containing the data length in hex (0 .. 40)\n");
  fprintf(_stderr,"  <can_data>  is always 64(!) u8 values containing the CAN FD frames data\n");
  fprintf(_stderr,"The max. four modifications are performed in the order AND -> OR -> XOR -> SET\n"
         );
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Supported CRC 8 profiles:\n");
  fprintf(_stderr," Profile \'%d\' (1U8)        add one additional u8 value\n",1);
  fprintf(_stderr,
          " Profile \'%d\' (16U8)       add u8 value from table[16] indexed by (data[1] & 0xF)\n",2)
  ;
  fprintf(_stderr,
          " Profile \'%d\' (SFFID_XOR)  add u8 value (can_id & 0xFF) ^ (can_id >> 8 & 0xFF)\n",3);
  fprintf(_stderr,"\n");
  fprintf(_stderr,"Examples:\n");
  fprintf(_stderr,"%s -A -s can0 -d vcan3 -e -f 123:C00007FF -m SET:IL:333.4.1122334455667788\n",
          in_RDI);
  fprintf(_stderr,"\n");
  return;
}

Assistant:

static void print_usage(char *prg)
{
	fprintf(stderr, "%s - manage PF_CAN netlink gateway.\n", prg);
	fprintf(stderr, "\nUsage: %s [options]\n\n", prg);
	fprintf(stderr, "Commands:\n");
	fprintf(stderr, "          -A  (add a new rule)\n");
	fprintf(stderr, "          -D  (delete a rule)\n");
	fprintf(stderr, "          -F  (flush / delete all rules)\n");
	fprintf(stderr, "          -L  (list all rules)\n");
	fprintf(stderr, "Mandatory:\n");
	fprintf(stderr, "          -s <src_dev>  (source netdevice)\n");
	fprintf(stderr, "          -d <dst_dev>  (destination netdevice)\n");
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "          -X  (this is a CAN FD rule)\n");
	fprintf(stderr, "          -t  (preserve src_dev rx timestamp)\n");
	fprintf(stderr, "          -e  (echo sent frames - recommended on vcanx)\n");
	fprintf(stderr, "          -i  (allow to route to incoming interface)\n");
	fprintf(stderr, "          -u <uid>  (user defined modification identifier)\n");
	fprintf(stderr, "          -l <hops>  (limit the number of frame hops / routings)\n");
	fprintf(stderr, "          -f <filter>  (set CAN filter)\n");
	fprintf(stderr, "          -m <mod>  (set Classical CAN frame modifications)\n");
	fprintf(stderr, "          -M <MOD>  (set CAN FD frame modifications)\n");
	fprintf(stderr, "          -x <from_idx>:<to_idx>:<result_idx>:<init_xor_val>  (XOR checksum)\n");
	fprintf(stderr, "          -c <from>:<to>:<result>:<init_val>:<xor_val>:<crctab[256]>  (CRC8 cs)\n");
	fprintf(stderr, "          -p <profile>:[<profile_data>]  (CRC8 checksum profile & parameters)\n");
	fprintf(stderr, "\nValues are given and expected in hexadecimal values. Leading 0s can be omitted.\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "<filter> is a <value><mask> CAN identifier filter:\n");
	fprintf(stderr, "  <can_id>:<can_mask>  (matches when <received_can_id> & mask == can_id & mask)\n");
	fprintf(stderr, "  <can_id>~<can_mask>  (matches when <received_can_id> & mask != can_id & mask)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "<mod> is a Classical CAN frame modification instruction consisting of\n");
	fprintf(stderr, "<instruction>:<can_frame-elements>:<can_id>.<can_dlc>.<can_data>\n");
	fprintf(stderr, "  <instruction>  is one of 'AND' 'OR' 'XOR' 'SET'\n");
	fprintf(stderr, "  <can_frame-elements>  is _one_ or _more_ of 'I'dentifier 'L'ength 'D'ata\n");
	fprintf(stderr, "  <can_id>  is an u32 value containing the CAN Identifier\n");
	fprintf(stderr, "  <can_dlc>  is an u8 value containing the data length code in hex (0 .. F)\n");
	fprintf(stderr, "  <can_data>  is always eight(!) u8 values containing the CAN frames data\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "<MOD> is a CAN FD frame modification instruction consisting of\n");
	fprintf(stderr, "<instruction>:<canfd_frame-elements>:<can_id>.<flags>.<len>.<can_data>\n");
	fprintf(stderr, "  <instruction>  is one of 'AND' 'OR' 'XOR' 'SET'\n");
	fprintf(stderr, "  <canfd_frame-elements>  is _one_ or _more_ of 'I'd 'F'lags 'L'ength 'D'ata\n");
	fprintf(stderr, "  <can_id>  is an u32 value containing the CAN FD Identifier\n");
	fprintf(stderr, "  <flags>  is an u8 value containing CAN FD flags (CANFD_BRS, CANFD_ESI)\n");
	fprintf(stderr, "  <len>  is an u8 value containing the data length in hex (0 .. 40)\n");
	fprintf(stderr, "  <can_data>  is always 64(!) u8 values containing the CAN FD frames data\n");
	fprintf(stderr, "The max. four modifications are performed in the order AND -> OR -> XOR -> SET\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "Supported CRC 8 profiles:\n");
	fprintf(stderr, " Profile '%d' (1U8)        add one additional u8 value\n", CGW_CRC8PRF_1U8);
	fprintf(stderr, " Profile '%d' (16U8)       add u8 value from table[16] indexed by (data[1] & 0xF)\n", CGW_CRC8PRF_16U8);
	fprintf(stderr, " Profile '%d' (SFFID_XOR)  add u8 value (can_id & 0xFF) ^ (can_id >> 8 & 0xFF)\n", CGW_CRC8PRF_SFFID_XOR);
	fprintf(stderr, "\n");
	fprintf(stderr, "Examples:\n");
	fprintf(stderr, "%s -A -s can0 -d vcan3 -e -f 123:C00007FF -m SET:IL:333.4.1122334455667788\n", prg);
	fprintf(stderr, "\n");
}